

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

gdImagePtr gdImageCreateFromBmp(FILE *inFile)

{
  gdIOCtx *infile;
  gdIOCtx *in;
  gdImagePtr im;
  FILE *inFile_local;
  
  infile = gdNewFileCtx(inFile);
  if (infile == (gdIOCtx *)0x0) {
    inFile_local = (FILE *)0x0;
  }
  else {
    inFile_local = (FILE *)gdImageCreateFromBmpCtx(infile);
    (*infile->gd_free)(infile);
  }
  return (gdImagePtr)inFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmp(FILE * inFile)
{
	gdImagePtr im = 0;
	gdIOCtx *in = gdNewFileCtx(inFile);
	if (in == NULL) return NULL;
	im = gdImageCreateFromBmpCtx(in);
	in->gd_free(in);
	return im;
}